

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType translate_one(CPUS390XState_conflict *env,DisasContext_conflict13 *s)

{
  TCGContext_conflict12 *tcg_ctx_00;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  DisasInsn *pDVar4;
  TCGv_i64 arg2;
  uint8_t local_71;
  uint8_t dxc;
  TCGv_i64 addr;
  DisasOps o;
  DisasJumpType ret;
  DisasInsn *insn;
  TCGContext_conflict12 *tcg_ctx;
  DisasContext_conflict13 *s_local;
  CPUS390XState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  o.addr1._4_4_ = DISAS_NEXT;
  memset(&addr,0,0x30);
  pDVar4 = extract_insn(env,s);
  tcg_gen_insn_start(tcg_ctx_00,(s->base).pc_next,(ulong)s->cc_op,(ulong)s->ilen);
  _Var1 = _hook_exists_bounded(s->uc->hook[2].head,(s->base).pc_next);
  if (_Var1) {
    gen_uc_tracecode(tcg_ctx_00,s->ilen,2,s->uc,(s->base).pc_next);
    check_exit_request_s390x(tcg_ctx_00);
  }
  if (pDVar4 == (DisasInsn *)0x0) {
    gen_illegal_opcode(s);
    return DISAS_NORETURN;
  }
  if ((((s->base).tb)->flags & 0x80000000) != 0) {
    arg2 = tcg_const_i64_s390x(tcg_ctx_00,(s->base).pc_next);
    gen_helper_per_ifetch(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
    tcg_temp_free_i64(tcg_ctx_00,arg2);
  }
  if ((*(ulong *)pDVar4 >> 0x10 & 0xffff) != 0) {
    if (((((s->base).tb)->flags & 0x20000) != 0) &&
       (((undefined1  [72])*pDVar4 & (undefined1  [72])0x200000) != (undefined1  [72])0x0)) {
      gen_program_exception(s,2);
      return DISAS_NORETURN;
    }
    if ((((s->base).tb)->flags & 0x40000000) == 0) {
      local_71 = '\0';
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x10000) != (undefined1  [72])0x0) {
        iVar2 = get_field1(s,FLD_O_r1,FLD_C_b1);
        _Var1 = is_afp_reg(iVar2);
        if (_Var1) {
          local_71 = '\x01';
        }
      }
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x20000) != (undefined1  [72])0x0) {
        iVar2 = get_field1(s,FLD_O_r2,FLD_C_b2);
        _Var1 = is_afp_reg(iVar2);
        if (_Var1) {
          local_71 = '\x01';
        }
      }
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x40000) != (undefined1  [72])0x0) {
        iVar2 = get_field1(s,FLD_O_r3,FLD_C_i3);
        _Var1 = is_afp_reg(iVar2);
        if (_Var1) {
          local_71 = '\x01';
        }
      }
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x80000) != (undefined1  [72])0x0) {
        local_71 = '\x02';
      }
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x100000) != (undefined1  [72])0x0) {
        local_71 = '\x03';
      }
      if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x400000) != (undefined1  [72])0x0) {
        local_71 = 0xfe;
      }
      if (local_71 != '\0') {
        gen_data_exception(tcg_ctx_00,local_71);
        return DISAS_NORETURN;
      }
    }
    if ((((undefined1  [72])*pDVar4 & (undefined1  [72])0x400000) != (undefined1  [72])0x0) &&
       ((((s->base).tb)->flags & 0x20000000) == 0)) {
      gen_data_exception(tcg_ctx_00,0xfe);
      return DISAS_NORETURN;
    }
  }
  if ((*(ulong *)pDVar4 >> 0x30 & 0xff) != 0) {
    if ((((((undefined1  [72])*pDVar4 & (undefined1  [72])0x1000000000000) != (undefined1  [72])0x0)
         && (uVar3 = get_field1(s,FLD_O_r1,FLD_C_b1), (uVar3 & 1) != 0)) ||
        ((((undefined1  [72])*pDVar4 & (undefined1  [72])0x2000000000000) != (undefined1  [72])0x0
         && (uVar3 = get_field1(s,FLD_O_r2,FLD_C_b2), (uVar3 & 1) != 0)))) ||
       ((((undefined1  [72])*pDVar4 & (undefined1  [72])0x4000000000000) != (undefined1  [72])0x0 &&
        (uVar3 = get_field1(s,FLD_O_r3,FLD_C_i3), (uVar3 & 1) != 0)))) {
LAB_01256854:
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x8000000000000) != (undefined1  [72])0x0) {
      iVar2 = get_field1(s,FLD_O_r1,FLD_C_b1);
      _Var1 = is_fp_pair(iVar2);
      if (!_Var1) goto LAB_01256854;
    }
    if (((undefined1  [72])*pDVar4 & (undefined1  [72])0x10000000000000) != (undefined1  [72])0x0) {
      iVar2 = get_field1(s,FLD_O_r2,FLD_C_b2);
      _Var1 = is_fp_pair(iVar2);
      if (!_Var1) goto LAB_01256854;
    }
  }
  if (pDVar4->help_in1 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar4->help_in1)(s,(DisasOps *)&addr);
  }
  if (pDVar4->help_in2 != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar4->help_in2)(s,(DisasOps *)&addr);
  }
  if (pDVar4->help_prep != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
    (*pDVar4->help_prep)(s,(DisasOps *)&addr);
  }
  if (pDVar4->help_op != (_func_DisasJumpType_DisasContext_ptr_DisasOps_ptr *)0x0) {
    o.addr1._4_4_ = (*pDVar4->help_op)(s,(DisasOps *)&addr);
  }
  if (o.addr1._4_4_ != DISAS_NORETURN) {
    if (pDVar4->help_wout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
      (*pDVar4->help_wout)(s,(DisasOps *)&addr);
    }
    if (pDVar4->help_cout != (_func_void_DisasContext_ptr_DisasOps_ptr *)0x0) {
      (*pDVar4->help_cout)(s,(DisasOps *)&addr);
    }
  }
  if ((o._0_8_ != 0) && (((byte)addr & 1) == 0)) {
    tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)o._0_8_);
  }
  if ((o.out != (TCGv_i64)0x0) && ((addr._1_1_ & 1) == 0)) {
    tcg_temp_free_i64(tcg_ctx_00,o.out);
  }
  if ((o.out2 != (TCGv_i64)0x0) && ((addr._2_1_ & 1) == 0)) {
    tcg_temp_free_i64(tcg_ctx_00,o.out2);
  }
  if ((o.in1 != (TCGv_i64)0x0) && ((addr._3_1_ & 1) == 0)) {
    tcg_temp_free_i64(tcg_ctx_00,o.in1);
  }
  if (o.in2 != (TCGv_i64)0x0) {
    tcg_temp_free_i64(tcg_ctx_00,o.in2);
  }
  if ((((s->base).tb)->flags & 0x80000000) != 0) {
    if ((o.addr1._4_4_ == DISAS_NEXT) || (o.addr1._4_4_ == DISAS_TARGET_3)) {
      tcg_gen_movi_i64_s390x(tcg_ctx_00,tcg_ctx_00->psw_addr,s->pc_tmp);
    }
    gen_helper_per_check_exception(tcg_ctx_00,tcg_ctx_00->cpu_env);
  }
  (s->base).pc_next = s->pc_tmp;
  return o.addr1._4_4_;
}

Assistant:

static DisasJumpType translate_one(CPUS390XState *env, DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const DisasInsn *insn;
    DisasJumpType ret = DISAS_NEXT;
    DisasOps o = { 0 };

    /* Search for the insn in the table.  */
    insn = extract_insn(env, s);

    /* Emit insn_start now that we know the ILEN.  */
    tcg_gen_insn_start(tcg_ctx, s->base.pc_next, s->cc_op, s->ilen);

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(s->uc, UC_HOOK_CODE, s->base.pc_next)) {
        gen_uc_tracecode(tcg_ctx, s->ilen, UC_HOOK_CODE_IDX, s->uc, s->base.pc_next);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    /* Not found means unimplemented/illegal opcode.  */
    if (insn == NULL) {
        // qemu_log_mask(LOG_UNIMP, "unimplemented opcode 0x%02x%02x\n",
        //               s->fields.op, s->fields.op2);
        gen_illegal_opcode(s);
        return DISAS_NORETURN;
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        TCGv_i64 addr = tcg_const_i64(tcg_ctx, s->base.pc_next);
        gen_helper_per_ifetch(tcg_ctx, tcg_ctx->cpu_env, addr);
        tcg_temp_free_i64(tcg_ctx, addr);
    }

    /* process flags */
    if (insn->flags) {
        /* privileged instruction */
        if ((s->base.tb->flags & FLAG_MASK_PSTATE) && (insn->flags & IF_PRIV)) {
            gen_program_exception(s, PGM_PRIVILEGED);
            return DISAS_NORETURN;
        }

        /* if AFP is not enabled, instructions and registers are forbidden */
        if (!(s->base.tb->flags & FLAG_MASK_AFP)) {
            uint8_t dxc = 0;

            if ((insn->flags & IF_AFP1) && is_afp_reg(get_field(s, r1))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP2) && is_afp_reg(get_field(s, r2))) {
                dxc = 1;
            }
            if ((insn->flags & IF_AFP3) && is_afp_reg(get_field(s, r3))) {
                dxc = 1;
            }
            if (insn->flags & IF_BFP) {
                dxc = 2;
            }
            if (insn->flags & IF_DFP) {
                dxc = 3;
            }
            if (insn->flags & IF_VEC) {
                dxc = 0xfe;
            }
            if (dxc) {
                gen_data_exception(tcg_ctx, dxc);
                return DISAS_NORETURN;
            }
        }

        /* if vector instructions not enabled, executing them is forbidden */
        if (insn->flags & IF_VEC) {
            if (!((s->base.tb->flags & FLAG_MASK_VECTOR))) {
                gen_data_exception(tcg_ctx, 0xfe);
                return DISAS_NORETURN;
            }
        }
    }

    /* Check for insn specification exceptions.  */
    if (insn->spec) {
        if ((insn->spec & SPEC_r1_even && get_field(s, r1) & 1) ||
            (insn->spec & SPEC_r2_even && get_field(s, r2) & 1) ||
            (insn->spec & SPEC_r3_even && get_field(s, r3) & 1) ||
            (insn->spec & SPEC_r1_f128 && !is_fp_pair(get_field(s, r1))) ||
            (insn->spec & SPEC_r2_f128 && !is_fp_pair(get_field(s, r2)))) {
            gen_program_exception(s, PGM_SPECIFICATION);
            return DISAS_NORETURN;
        }
    }

    /* Implement the instruction.  */
    if (insn->help_in1) {
        insn->help_in1(s, &o);
    }
    if (insn->help_in2) {
        insn->help_in2(s, &o);
    }
    if (insn->help_prep) {
        insn->help_prep(s, &o);
    }
    if (insn->help_op) {
        ret = insn->help_op(s, &o);
    }
    if (ret != DISAS_NORETURN) {
        if (insn->help_wout) {
            insn->help_wout(s, &o);
        }
        if (insn->help_cout) {
            insn->help_cout(s, &o);
        }
    }

    /* Free any temporaries created by the helpers.  */
    if (o.out && !o.g_out) {
        tcg_temp_free_i64(tcg_ctx, o.out);
    }
    if (o.out2 && !o.g_out2) {
        tcg_temp_free_i64(tcg_ctx, o.out2);
    }
    if (o.in1 && !o.g_in1) {
        tcg_temp_free_i64(tcg_ctx, o.in1);
    }
    if (o.in2 && !o.g_in2) {
        tcg_temp_free_i64(tcg_ctx, o.in2);
    }
    if (o.addr1) {
        tcg_temp_free_i64(tcg_ctx, o.addr1);
    }

    if (s->base.tb->flags & FLAG_MASK_PER) {
        /* An exception might be triggered, save PSW if not already done.  */
        if (ret == DISAS_NEXT || ret == DISAS_PC_STALE) {
            tcg_gen_movi_i64(tcg_ctx, tcg_ctx->psw_addr, s->pc_tmp);
        }

        /* Call the helper to check for a possible PER exception.  */
        gen_helper_per_check_exception(tcg_ctx, tcg_ctx->cpu_env);
    }

    /* Advance to the next instruction.  */
    s->base.pc_next = s->pc_tmp;
    return ret;
}